

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseLatency(Parser *this)

{
  uint32_t uVar1;
  int64_t iVar2;
  Module *pMVar3;
  CompileMessage local_c0;
  Value local_78;
  long local_38;
  int64_t latency;
  CodeLocation errorPos;
  Parser *this_local;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4d44a1);
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,"latency");
  errorPos.location.data = "=";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4aecb7);
  CodeLocation::CodeLocation
            ((CodeLocation *)&latency,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  parseInt32Value(&local_78,this);
  iVar2 = soul::Value::getAsInt64(&local_78);
  soul::Value::~Value(&local_78);
  local_38 = iVar2;
  expectSemicolon(this);
  if ((-1 < local_38) && (local_38 < 0xea601)) {
    uVar1 = (uint32_t)local_38;
    pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
    pMVar3->latency = uVar1;
    CodeLocation::~CodeLocation((CodeLocation *)&latency);
    return;
  }
  Errors::latencyOutOfRange<>();
  CodeLocation::throwError((CodeLocation *)&latency,&local_c0);
}

Assistant:

void parseLatency()
    {
        expect (HEARTOperator::dot);
        expect ("latency");
        expect (HEARTOperator::assign);
        auto errorPos = location;
        auto latency = parseInt32Value().getAsInt64();
        expectSemicolon();

        if (latency < 0 || latency > AST::maxInternalLatency)
            errorPos.throwError (Errors::latencyOutOfRange());

        module->latency = static_cast<uint32_t> (latency);
    }